

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genCaseIdentifiers_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  string *__return_storage_ptr___00;
  size_t sVar1;
  TDNode *__rhs;
  long lVar2;
  size_t rel;
  ulong uVar3;
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string returnString;
  string local_50;
  
  local_98 = __return_storage_ptr__;
  offset_abi_cxx11_(&sStack_d8,this,1);
  std::operator+(&returnString,&sStack_d8,"enum ID {");
  std::__cxx11::string::~string((string *)&sStack_d8);
  uVar3 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar3) break;
    offset_abi_cxx11_(&local_50,this,2);
    std::operator+(&local_90,"\n",&local_50);
    __rhs = TreeDecomposition::getRelation
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,uVar3);
    std::operator+(&local_b8,&local_90,&__rhs->_name);
    std::operator+(&sStack_d8,&local_b8,"_ID,");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = uVar3 + 1;
  }
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= uVar3) break;
    offset_abi_cxx11_(&local_50,this,2);
    std::operator+(&local_90,"\n",&local_50);
    std::operator+(&local_b8,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(this->viewName->_M_dataplus)._M_p + lVar2));
    std::operator+(&sStack_d8,&local_b8,"_ID,");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x20;
  }
  std::__cxx11::string::pop_back();
  std::operator+(&local_b8,&returnString,"\n");
  offset_abi_cxx11_(&local_90,this,1);
  __return_storage_ptr___00 = local_98;
  std::operator+(&sStack_d8,&local_b8,&local_90);
  std::operator+(__return_storage_ptr___00,&sStack_d8,"};\n");
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&returnString);
  return __return_storage_ptr___00;
}

Assistant:

std::string CppGenerator::genCaseIdentifiers()
{
    std::string returnString = offset(1)+"enum ID {";

    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        returnString += "\n"+offset(2)+_td->getRelation(rel)->_name+"_ID,";

    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
        returnString += "\n"+offset(2)+viewName[view]+"_ID,";
    returnString.pop_back();

    return returnString+"\n"+offset(1)+"};\n";
}